

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxun(prscxdef *ctx,prsbdef *binctx)

{
  int iVar1;
  prsndef *ppVar2;
  prscxdef *in_RSI;
  prscxdef *in_RDI;
  tokcxdef *in_stack_00000008;
  tokdef tok;
  int t;
  tokdef *in_stack_ffffffffffffff48;
  prscxdef *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int t_00;
  prscxdef *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffe0;
  prscxdef *in_stack_fffffffffffffff8;
  
  t_00 = *(int *)((long)&((anon_union_112_2_d7e41247_for_prsnv *)&in_RDI->prscxtok)->prsnvn[0][2].
                         prsnv + 0x28);
  if ((((t_00 == 2) || (t_00 == 3)) || (t_00 == 6)) ||
     (((t_00 == 0x96 || (t_00 == 0x98)) || ((t_00 == 0x1e || (t_00 == 0x5f)))))) {
    toknext(in_stack_00000008);
    prsxun(in_RSI,(prsbdef *)CONCAT44(t_00,in_stack_ffffffffffffffe0));
    ppVar2 = prsnew1(in_RDI,in_stack_ffffffffffffff5c,(prsndef *)in_stack_ffffffffffffff50);
  }
  else if (t_00 == 0x5e) {
    iVar1 = toknext(in_stack_00000008);
    if (iVar1 == 0x49) {
      toknext(in_stack_00000008);
      ppVar2 = prsnew0(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      prsxun(in_RSI,(prsbdef *)CONCAT44(t_00,in_stack_ffffffffffffffe0));
      ppVar2 = prsnew1(in_stack_ffffffffffffff60,t_00,(prsndef *)in_RDI);
    }
  }
  else {
    ppVar2 = prsxmem(in_stack_fffffffffffffff8);
  }
  return ppVar2;
}

Assistant:

static prsndef *prsxun(prscxdef *ctx, prsbdef *binctx)
{
    int      t;
    
    VARUSED(binctx);

    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTPLUS || t == TOKTMINUS || t == TOKTNOT
        || t == TOKTINC || t == TOKTDEC || t == TOKTTILDE
        || t == TOKTDELETE)
    {
        toknext(ctx->prscxtok);
        return(prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0)));
    }
    else if (t == TOKTNEW)
    {
        if (toknext(ctx->prscxtok) == TOKTOBJECT)
        {
            tokdef tok;

            toknext(ctx->prscxtok);
            tok.toktyp = TOKTNEW;
            return prsnew0(ctx, &tok);
        }
        else
            return prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0));
    }
    return(prsxmem(ctx));
}